

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckArrayEqual<int[3],int[3]>
               (TestResults *results,int (*expected) [3],int (*actual) [3],int count,
               TestDetails *details)

{
  ulong uVar1;
  ostream *poVar2;
  char *failure;
  bool bVar3;
  int actualIndex;
  int expectedIndex;
  ulong uVar4;
  MemoryOutStream stream;
  MemoryOutStream local_1c8;
  
  uVar1 = 0;
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar1;
  }
  bVar3 = true;
  for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    bVar3 = (bool)(bVar3 & (*expected)[uVar1] == (*actual)[uVar1]);
  }
  if (!bVar3) {
    MemoryOutStream::MemoryOutStream(&local_1c8);
    std::operator<<((ostream *)&local_1c8,"Expected [ ");
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(&local_1c8,(*expected)[uVar1]);
      std::operator<<(poVar2," ");
    }
    std::operator<<((ostream *)&local_1c8,"] but was [ ");
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(&local_1c8,(*actual)[uVar1]);
      std::operator<<(poVar2," ");
    }
    std::operator<<((ostream *)&local_1c8,"]");
    failure = MemoryOutStream::GetText(&local_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c8);
  }
  return;
}

Assistant:

void CheckArrayEqual(TestResults& results, Expected const& expected, Actual const& actual,
                int const count, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < count; ++i)
        equal &= (expected[i] == actual[i]);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

		stream << "Expected [ ";

		for (int expectedIndex = 0; expectedIndex < count; ++expectedIndex)
            stream << expected[expectedIndex] << " ";

		stream << "] but was [ ";

		for (int actualIndex = 0; actualIndex < count; ++actualIndex)
            stream << actual[actualIndex] << " ";

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}